

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcf_strfold(int n,mpc_val_t **xs)

{
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (n != 0) {
    uVar5 = 0;
    uVar3 = 0;
    if (0 < n) {
      uVar3 = (ulong)(uint)n;
    }
    lVar4 = 0;
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      sVar1 = strlen((char *)xs[uVar5]);
      lVar4 = lVar4 + sVar1;
    }
    pvVar2 = realloc(*xs,lVar4 + 1);
    *xs = pvVar2;
    for (lVar4 = 1; lVar4 < n; lVar4 = lVar4 + 1) {
      strcat((char *)*xs,(char *)xs[lVar4]);
      free(xs[lVar4]);
    }
    return (char *)*xs;
  }
  pvVar2 = calloc(1,1);
  return pvVar2;
}

Assistant:

mpc_val_t *mpcf_strfold(int n, mpc_val_t **xs) {
  int i;
  size_t l = 0;

  if (n == 0) { return calloc(1, 1); }

  for (i = 0; i < n; i++) { l += strlen(xs[i]); }

  xs[0] = realloc(xs[0], l + 1);

  for (i = 1; i < n; i++) {
    strcat(xs[0], xs[i]); free(xs[i]);
  }

  return xs[0];
}